

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O0

void cppwinrt::throw_invalid<std::__cxx11::string,char[35]>
               (string *message,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char (*args_1) [35])

{
  invalid_argument *this;
  char (*args_local_1) [35];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *message_local;
  
  ::std::__cxx11::string::append((string *)message);
  ::std::__cxx11::string::append((char *)message);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::invalid_argument::invalid_argument(this,(string *)message);
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

[[noreturn]] inline void throw_invalid(std::string message, T const&... args)
    {
        (message.append(args), ...);
        throw std::invalid_argument(message);
    }